

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O3

void DumpGraph(ScopeData *scope)

{
  ExpressionGraphContext exprGraphCtx;
  char tempBuf [4096];
  char outputBuf [4096];
  ExpressionContext exprCtx;
  ExpressionGraphContext local_acd0;
  OutputContext local_acb8;
  char local_aa78 [4096];
  char local_9a78 [4104];
  ExpressionContext local_8a70;
  
  ExpressionContext::ExpressionContext(&local_8a70,(Allocator *)0x0,0);
  local_acb8.openStream = OutputContext::FileOpen;
  local_acb8.closeStream = OutputContext::FileClose;
  local_acb8.outputBufSize = 0x1000;
  local_acb8.outputBufPos = 0;
  local_acb8.outputBuf = local_9a78;
  local_acb8.tempBuf = local_aa78;
  local_acb8.tempBufSize = 0x1000;
  local_acb8.stream = fopen("expr_graph.txt","w");
  local_acb8.writeStream = OutputContext::FileWrite;
  local_acd0.depth = 0;
  local_acd0.skipImported = false;
  local_acd0.skipFunctionDefinitions = false;
  local_acd0.ctx = &local_8a70;
  local_acd0.output = &local_acb8;
  PrintGraph(&local_acd0,scope,true);
  PrintGraph(&local_acd0,scope,false);
  fclose((FILE *)local_acb8.stream);
  local_acb8.stream = (void *)0x0;
  OutputContext::~OutputContext(&local_acb8);
  ExpressionContext::~ExpressionContext(&local_8a70);
  return;
}

Assistant:

void DumpGraph(ScopeData *scope)
{
	ExpressionContext exprCtx(0, 0);
	OutputContext outputCtx;

	char outputBuf[4096];
	outputCtx.outputBuf = outputBuf;
	outputCtx.outputBufSize = 4096;

	char tempBuf[4096];
	outputCtx.tempBuf = tempBuf;
	outputCtx.tempBufSize = 4096;

	outputCtx.stream = OutputContext::FileOpen("expr_graph.txt");
	outputCtx.writeStream = OutputContext::FileWrite;

	ExpressionGraphContext exprGraphCtx(exprCtx, outputCtx);

	PrintGraph(exprGraphCtx, scope, true);

	PrintGraph(exprGraphCtx, scope, false);

	OutputContext::FileClose(outputCtx.stream);
	outputCtx.stream = NULL;
}